

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

double measure_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&),int>
                 (_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                  **solving_function,
                 matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                 *cost_matrix)

{
  _func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  *p_Var1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  ostream *poVar6;
  rep_conflict rVar7;
  undefined1 auVar8 [16];
  DurationFormatter local_c0;
  DurationFormatter local_b8;
  int local_b0;
  fmtflags local_ac;
  size_type local_a8;
  size_type local_a0;
  ulong local_98;
  size_t row;
  double c;
  duration<long,_boost::ratio<1L,_1000000000L>_> local_80;
  duration<double,_boost::ratio<1L,_1L>_> local_78;
  duration<double,_boost::ratio<1L,_1L>_> dt;
  undefined8 local_60;
  time_point start_time;
  vector<unsigned_long,_std::allocator<unsigned_long>_> assignment;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  *cost_matrix_local;
  _func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
  **solving_function_local;
  duration<double,_boost::ratio<1L,_1L>_> local_28;
  undefined8 local_20;
  duration<long,_boost::ratio<1L,_1000000000L>_> *local_18;
  duration<double,_boost::ratio<1L,_1L>_> *local_10;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_time);
  local_60 = boost::chrono::steady_clock::now();
  p_Var1 = *solving_function;
  sVar3 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size1(cost_matrix);
  sVar4 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size2(cost_matrix);
  (*p_Var1)(cost_matrix,sVar3,sVar4,
            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_time);
  c = (double)boost::chrono::steady_clock::now();
  local_80.rep_ =
       (rep)boost::chrono::operator-
                      ((time_point<boost::chrono::steady_clock,_boost::chrono::duration<long,_boost::ratio<1L,_1000000000L>_>_>
                        *)&c,(time_point<boost::chrono::steady_clock,_boost::chrono::duration<long,_boost::ratio<1L,_1000000000L>_>_>
                              *)&local_60);
  local_10 = &local_78;
  local_18 = &local_80;
  local_20 = 0;
  local_28 = boost::chrono::detail::
             duration_cast<boost::chrono::duration<long,_boost::ratio<1L,_1000000000L>_>,_boost::chrono::duration<double,_boost::ratio<1L,_1L>_>_>
             ::operator()((duration_cast<boost::chrono::duration<long,_boost::ratio<1L,_1000000000L>_>,_boost::chrono::duration<double,_boost::ratio<1L,_1L>_>_>
                           *)((long)&solving_function_local + 7),local_18);
  local_78.rep_ = boost::chrono::duration<double,_boost::ratio<1L,_1L>_>::count(&local_28);
  row = 0x3ff0000000000000;
  local_98 = 1;
  while( true ) {
    uVar2 = local_98;
    local_a0 = boost::numeric::ublas::
               matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               ::size1(cost_matrix);
    local_a8 = boost::numeric::ublas::
               matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               ::size2(cost_matrix);
    puVar5 = std::max<unsigned_long>(&local_a0,&local_a8);
    if (*puVar5 < uVar2) break;
    auVar8._8_4_ = (int)(local_98 >> 0x20);
    auVar8._0_8_ = local_98;
    auVar8._12_4_ = 0x45300000;
    row = (size_t)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0)) * (double)row)
    ;
    local_98 = local_98 + 1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"  Time to solve ");
  sVar3 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size1(cost_matrix);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar3);
  poVar6 = std::operator<<(poVar6,"x");
  sVar3 = boost::numeric::ublas::
          matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
          ::size2(cost_matrix);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar3);
  poVar6 = std::operator<<(poVar6," assignment problem (");
  local_ac = (fmtflags)std::resetiosflags(_S_floatfield);
  poVar6 = std::operator<<(poVar6,(_Resetiosflags)local_ac);
  local_b0 = (int)std::setprecision(8);
  poVar6 = std::operator<<(poVar6,(_Setprecision)local_b0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)row);
  poVar6 = std::operator<<(poVar6," combinations): ");
  rVar7 = boost::chrono::duration<double,_boost::ratio<1L,_1L>_>::count(&local_78);
  DurationFormatter::DurationFormatter(&local_b8,rVar7);
  poVar6 = operator<<(poVar6,&local_b8);
  poVar6 = std::operator<<(poVar6," (");
  rVar7 = boost::chrono::duration<double,_boost::ratio<1L,_1L>_>::count(&local_78);
  DurationFormatter::DurationFormatter(&local_c0,rVar7 / (double)row);
  poVar6 = operator<<(poVar6,&local_c0);
  poVar6 = std::operator<<(poVar6," per combination)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  rVar7 = boost::chrono::duration<double,_boost::ratio<1L,_1L>_>::count(&local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_time);
  return rVar7;
}

Assistant:

double measure_solver_timing(const SolvingFunction& solving_function, const ublas::matrix<Cost>& cost_matrix)
{
  typedef boost::chrono::high_resolution_clock Clock;
  std::vector<std::size_t> assignment;
  const Clock::time_point start_time(Clock::now());
  solving_function(cost_matrix, cost_matrix.size1(), cost_matrix.size2(), assignment);
  const boost::chrono::duration<double> dt(Clock::now() - start_time);

  // Compute number of combinations = factorial of larger dimension of matrix:
  double c = 1;  // size_t gets too small fast
  for (std::size_t row = 1; row <= std::max(cost_matrix.size1(), cost_matrix.size2()); ++row)
  {
    c *= row;
  }

  std::cout << "  Time to solve " << cost_matrix.size1() << "x" << cost_matrix.size2() << " assignment problem ("
            << std::resetiosflags(std::ios::floatfield) << std::setprecision(8) << c << " combinations): "
            << DurationFormatter(dt.count()) << " (" << DurationFormatter(dt.count() / c) << " per combination)"
            << std::endl;
  return dt.count();
}